

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImFontAtlasBuildInit(ImFontAtlas *atlas)

{
  int iVar1;
  long in_RDI;
  int in_stack_00000018;
  int in_stack_0000001c;
  ImFontAtlas *in_stack_00000020;
  
  if (*(int *)(in_RDI + 0x47c) < 0) {
    if ((*(uint *)(in_RDI + 4) & 2) == 0) {
      iVar1 = ImFontAtlas::AddCustomRectRegular
                        (in_stack_00000020,in_stack_0000001c,in_stack_00000018);
      *(int *)(in_RDI + 0x47c) = iVar1;
    }
    else {
      iVar1 = ImFontAtlas::AddCustomRectRegular
                        (in_stack_00000020,in_stack_0000001c,in_stack_00000018);
      *(int *)(in_RDI + 0x47c) = iVar1;
    }
  }
  if ((*(int *)(in_RDI + 0x480) < 0) && ((*(uint *)(in_RDI + 4) & 4) == 0)) {
    iVar1 = ImFontAtlas::AddCustomRectRegular(in_stack_00000020,in_stack_0000001c,in_stack_00000018)
    ;
    *(int *)(in_RDI + 0x480) = iVar1;
  }
  return;
}

Assistant:

void ImFontAtlasBuildInit(ImFontAtlas* atlas)
{
    // Register texture region for mouse cursors or standard white pixels
    if (atlas->PackIdMouseCursors < 0)
    {
        if (!(atlas->Flags & ImFontAtlasFlags_NoMouseCursors))
            atlas->PackIdMouseCursors = atlas->AddCustomRectRegular(FONT_ATLAS_DEFAULT_TEX_DATA_W * 2 + 1, FONT_ATLAS_DEFAULT_TEX_DATA_H);
        else
            atlas->PackIdMouseCursors = atlas->AddCustomRectRegular(2, 2);
    }

    // Register texture region for thick lines
    // The +2 here is to give space for the end caps, whilst height +1 is to accommodate the fact we have a zero-width row
    if (atlas->PackIdLines < 0)
    {
        if (!(atlas->Flags & ImFontAtlasFlags_NoBakedLines))
            atlas->PackIdLines = atlas->AddCustomRectRegular(IM_DRAWLIST_TEX_LINES_WIDTH_MAX + 2, IM_DRAWLIST_TEX_LINES_WIDTH_MAX + 1);
    }
}